

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O1

string * __thiscall
CoreML::dimensionsToString_abi_cxx11_
          (string *__return_storage_ptr__,CoreML *this,vector<long,_std::allocator<long>_> *dims,
          bool useArrayFormat)

{
  byte bVar1;
  char *pcVar2;
  ulong uVar3;
  string separator;
  stringstream ss;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  bVar1 = (byte)dims;
  std::__cxx11::stringstream::stringstream(local_1b8);
  pcVar2 = anon_var_dwarf_6379ff;
  if ((int)dims != 0) {
    pcVar2 = ", ";
  }
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d8,pcVar2,pcVar2 + (ulong)(bVar1 ^ 1) * 2 + 2);
  if (bVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
  }
  if (*(long *)(this + 8) != *(long *)this) {
    uVar3 = 0;
    do {
      std::ostream::_M_insert<long>((long)local_1a8);
      if (uVar3 < (*(long *)(this + 8) - *(long *)this >> 3) - 1U) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_1d8,local_1d0);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)(*(long *)(this + 8) - *(long *)this >> 3));
  }
  if (bVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
  }
  std::__cxx11::stringbuf::str();
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

static std::string dimensionsToString(const std::vector<int64_t> &dims, bool useArrayFormat = false) {

        std::stringstream ss;
        std::string separator = useArrayFormat ? ", " : " × ";

        if (useArrayFormat) {
            ss << "[";
        }

        for (size_t i=0; i<dims.size(); i++) {
            ss << dims[i];
            if (i < dims.size() - 1) { ss << separator; }
        }

        if (useArrayFormat) {
            ss << "]";
        }

        return ss.str();
    }